

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

TestRole __thiscall testing::internal::ExecDeathTest::AssumeRole(ExecDeathTest *this)

{
  InternalRunDeathTestFlag *pIVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  long *plVar6;
  undefined8 *puVar7;
  int *piVar8;
  void *__addr;
  ulong *puVar9;
  __sighandler_t p_Var10;
  long *plVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  _union_1457 _Var13;
  long lVar14;
  ulong uVar15;
  undefined8 uVar16;
  _union_1457 *p_Var17;
  const_iterator cVar18;
  size_t __len;
  int pipe_fd [2];
  int death_test_index;
  ExecDeathTestArgs args_2;
  Arguments args;
  string internal_flag;
  string filter_flag;
  sigaction ignore_sigprof_action;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args_1;
  ulong *local_318;
  long local_310;
  ulong local_308;
  long lStack_300;
  ulong *local_2f8;
  long local_2f0;
  ulong local_2e8;
  long lStack_2e0;
  ulong *local_2d8;
  long local_2d0;
  ulong local_2c8;
  long lStack_2c0;
  _union_1457 local_2b8;
  long local_2b0;
  _union_1457 local_2a8;
  long lStack_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  string local_278;
  string local_258;
  int local_238;
  int local_234;
  string local_230;
  int local_20c;
  string local_208;
  string local_1e8;
  long *local_1c0;
  undefined8 local_1b8;
  long local_1b0;
  undefined8 uStack_1a8;
  string local_1a0;
  long *local_180;
  long local_178;
  long local_170;
  long lStack_168;
  _union_1457 local_160;
  undefined1 local_158 [8];
  ulong local_150;
  ulong uStack_148;
  _union_1457 local_c8;
  long local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8 [8];
  
  UnitTest::GetInstance();
  pIVar1 = ((UnitTest::GetInstance::instance.impl_)->internal_run_death_test_flag_)._M_t.
           super___uniq_ptr_impl<testing::internal::InternalRunDeathTestFlag,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           ._M_t.
           super__Tuple_impl<0UL,_testing::internal::InternalRunDeathTestFlag_*,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           .super__Head_base<0UL,_testing::internal::InternalRunDeathTestFlag_*,_false>._M_head_impl
  ;
  local_20c = ((UnitTest::GetInstance::instance.impl_)->current_test_info_->result_).
              death_test_count_;
  if (pIVar1 != (InternalRunDeathTestFlag *)0x0) {
    (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = pIVar1->write_fd_;
    return EXECUTE_TEST;
  }
  iVar3 = pipe(&local_238);
  if (iVar3 == -1) {
    local_2f8 = &local_2e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"CHECK failed: File ","");
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f8);
    local_318 = (ulong *)*puVar7;
    puVar9 = puVar7 + 2;
    if (local_318 == puVar9) {
      local_308 = *puVar9;
      lStack_300 = puVar7[3];
      local_318 = &local_308;
    }
    else {
      local_308 = *puVar9;
    }
    local_310 = puVar7[1];
    *puVar7 = puVar9;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_318);
    local_2d8 = (ulong *)*puVar7;
    puVar9 = puVar7 + 2;
    if (local_2d8 == puVar9) {
      local_2c8 = *puVar9;
      lStack_2c0 = puVar7[3];
      local_2d8 = &local_2c8;
    }
    else {
      local_2c8 = *puVar9;
    }
    local_2d0 = puVar7[1];
    *puVar7 = puVar9;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    local_258._M_dataplus._M_p._0_4_ = 0x592;
    StreamableToString<int>((string *)&local_298,(int *)&local_258);
    uVar15 = 0xf;
    if (local_2d8 != &local_2c8) {
      uVar15 = local_2c8;
    }
    if (uVar15 < (ulong)(local_298._8_8_ + local_2d0)) {
      uVar16 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_allocated_capacity != &local_288) {
        uVar16 = local_288._M_allocated_capacity;
      }
      if ((ulong)uVar16 < (ulong)(local_298._8_8_ + local_2d0)) goto LAB_00172fb6;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,(ulong)local_2d8);
    }
    else {
LAB_00172fb6:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2d8,local_298._M_allocated_capacity);
    }
    local_2b8.sa_handler = (__sighandler_t)*puVar7;
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8.sa_handler == paVar12) {
      local_2a8 = (_union_1457)paVar12->_M_allocated_capacity;
      lStack_2a0 = puVar7[3];
      local_2b8.sa_handler = (__sighandler_t)&local_2a8;
    }
    else {
      local_2a8 = (_union_1457)paVar12->_M_allocated_capacity;
    }
    local_2b0 = puVar7[1];
    *puVar7 = paVar12;
    puVar7[1] = 0;
    paVar12->_M_local_buf[0] = '\0';
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_2b8);
    local_160.sa_handler = (__sighandler_t)*puVar7;
    p_Var10 = (__sighandler_t)(puVar7 + 2);
    if (local_160.sa_handler == p_Var10) {
      local_150 = *(ulong *)p_Var10;
      uStack_148 = puVar7[3];
      local_160.sa_handler = (__sighandler_t)&local_150;
    }
    else {
      local_150 = *(ulong *)p_Var10;
    }
    local_158 = (undefined1  [8])puVar7[1];
    *puVar7 = p_Var10;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
LAB_001734c5:
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_160);
    local_c8.sa_handler = (__sighandler_t)*puVar7;
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.sa_handler != paVar12) goto LAB_00172d87;
    local_b8[0]._0_8_ = paVar12->_M_allocated_capacity;
    local_b8[0]._8_8_ = puVar7[3];
    local_c8.sa_handler = (__sighandler_t)local_b8;
    goto LAB_00172d92;
  }
  iVar3 = fcntl(local_234,2,0);
  if (iVar3 == -1) {
    local_2f8 = &local_2e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"CHECK failed: File ","");
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f8);
    local_318 = (ulong *)*puVar7;
    puVar9 = puVar7 + 2;
    if (local_318 == puVar9) {
      local_308 = *puVar9;
      lStack_300 = puVar7[3];
      local_318 = &local_308;
    }
    else {
      local_308 = *puVar9;
    }
    local_310 = puVar7[1];
    *puVar7 = puVar9;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_318);
    local_2d8 = (ulong *)*puVar7;
    puVar9 = puVar7 + 2;
    if (local_2d8 == puVar9) {
      local_2c8 = *puVar9;
      lStack_2c0 = puVar7[3];
      local_2d8 = &local_2c8;
    }
    else {
      local_2c8 = *puVar9;
    }
    local_2d0 = puVar7[1];
    *puVar7 = puVar9;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    local_258._M_dataplus._M_p._0_4_ = 0x595;
    StreamableToString<int>((string *)&local_298,(int *)&local_258);
    uVar15 = 0xf;
    if (local_2d8 != &local_2c8) {
      uVar15 = local_2c8;
    }
    if (uVar15 < (ulong)(local_298._8_8_ + local_2d0)) {
      uVar16 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_allocated_capacity != &local_288) {
        uVar16 = local_288._M_allocated_capacity;
      }
      if ((ulong)uVar16 < (ulong)(local_298._8_8_ + local_2d0)) goto LAB_001730ad;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,(ulong)local_2d8);
    }
    else {
LAB_001730ad:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2d8,local_298._M_allocated_capacity);
    }
    local_2b8.sa_handler = (__sighandler_t)*puVar7;
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8.sa_handler == paVar12) {
      local_2a8 = (_union_1457)paVar12->_M_allocated_capacity;
      lStack_2a0 = puVar7[3];
      local_2b8.sa_handler = (__sighandler_t)&local_2a8;
    }
    else {
      local_2a8 = (_union_1457)paVar12->_M_allocated_capacity;
    }
    local_2b0 = puVar7[1];
    *puVar7 = paVar12;
    puVar7[1] = 0;
    paVar12->_M_local_buf[0] = '\0';
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_2b8);
    local_160.sa_handler = (__sighandler_t)*puVar7;
    p_Var10 = (__sighandler_t)(puVar7 + 2);
    if (local_160.sa_handler == p_Var10) {
      local_150 = *(ulong *)p_Var10;
      uStack_148 = puVar7[3];
      local_160.sa_handler = (__sighandler_t)&local_150;
    }
    else {
      local_150 = *(ulong *)p_Var10;
    }
    local_158 = (undefined1  [8])puVar7[1];
    *puVar7 = p_Var10;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    goto LAB_001734c5;
  }
  local_2f8 = &local_2e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"--","");
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_2f8);
  puVar9 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar9) {
    local_308 = *puVar9;
    lStack_300 = plVar6[3];
    local_318 = &local_308;
  }
  else {
    local_308 = *puVar9;
    local_318 = (ulong *)*plVar6;
  }
  local_310 = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_318);
  puVar9 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar9) {
    local_2c8 = *puVar9;
    lStack_2c0 = plVar6[3];
    local_2d8 = &local_2c8;
  }
  else {
    local_2c8 = *puVar9;
    local_2d8 = (ulong *)*plVar6;
  }
  local_2d0 = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_2d8);
  p_Var17 = (_union_1457 *)(plVar6 + 2);
  if ((_union_1457 *)*plVar6 == p_Var17) {
    local_2a8 = *p_Var17;
    lStack_2a0 = plVar6[3];
    local_2b8.sa_handler = (__sighandler_t)&local_2a8;
  }
  else {
    local_2a8 = *p_Var17;
    local_2b8.sa_handler = (__sighandler_t)*plVar6;
  }
  local_2b0 = plVar6[1];
  *plVar6 = (long)p_Var17;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_2b8);
  local_160.sa_handler = (__sighandler_t)&local_150;
  p_Var10 = (__sighandler_t)(plVar6 + 2);
  if ((__sighandler_t)*plVar6 == p_Var10) {
    local_150 = *(ulong *)p_Var10;
    uStack_148 = plVar6[3];
  }
  else {
    local_150 = *(ulong *)p_Var10;
    local_160.sa_handler = (__sighandler_t)*plVar6;
  }
  local_158 = (undefined1  [8])plVar6[1];
  *plVar6 = (long)p_Var10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_160);
  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 == paVar12) {
    local_b8[0]._0_8_ = paVar12->_M_allocated_capacity;
    local_b8[0]._8_8_ = puVar7[3];
    local_c8.sa_handler = (__sighandler_t)local_b8;
  }
  else {
    local_b8[0]._0_8_ = paVar12->_M_allocated_capacity;
    local_c8.sa_handler = (__sighandler_t)*puVar7;
  }
  local_c0 = puVar7[1];
  *puVar7 = paVar12;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_c8);
  local_180 = &local_170;
  plVar11 = plVar6 + 2;
  if ((long *)*plVar6 == plVar11) {
    local_170 = *plVar11;
    lStack_168 = plVar6[3];
  }
  else {
    local_170 = *plVar11;
    local_180 = (long *)*plVar6;
  }
  local_178 = plVar6[1];
  *plVar6 = (long)plVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.sa_handler != local_b8) {
    operator_delete(local_c8.sa_handler,local_b8[0]._M_allocated_capacity + 1);
  }
  if (local_160.sa_handler != (__sighandler_t)&local_150) {
    operator_delete(local_160.sa_handler,local_150 + 1);
  }
  if ((_union_1457 *)local_2b8.sa_handler != &local_2a8) {
    operator_delete(local_2b8.sa_handler,(ulong)(local_2a8.sa_handler + 1));
  }
  if (local_2d8 != &local_2c8) {
    operator_delete(local_2d8,local_2c8 + 1);
  }
  if (local_318 != &local_308) {
    operator_delete(local_318,local_308 + 1);
  }
  if (local_2f8 != &local_2e8) {
    operator_delete(local_2f8,local_2e8 + 1);
  }
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"--","");
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_230);
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  puVar9 = (ulong *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar9) {
    local_278.field_2._M_allocated_capacity = *puVar9;
    local_278.field_2._8_8_ = plVar6[3];
  }
  else {
    local_278.field_2._M_allocated_capacity = *puVar9;
    local_278._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_278._M_string_length = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_278);
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  puVar9 = (ulong *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar9) {
    local_258.field_2._M_allocated_capacity = *puVar9;
    local_258.field_2._8_8_ = plVar6[3];
  }
  else {
    local_258.field_2._M_allocated_capacity = *puVar9;
    local_258._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_258._M_string_length = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_258);
  local_298._M_allocated_capacity = (size_type)&local_288;
  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 == paVar12) {
    local_288._M_allocated_capacity = paVar12->_M_allocated_capacity;
    local_288._8_8_ = plVar6[3];
  }
  else {
    local_288._M_allocated_capacity = paVar12->_M_allocated_capacity;
    local_298._M_allocated_capacity =
         (size_type)
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar6;
  }
  local_298._8_8_ = plVar6[1];
  *plVar6 = (long)paVar12;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append(local_298._M_local_buf);
  puVar9 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar9) {
    local_2e8 = *puVar9;
    lStack_2e0 = plVar6[3];
    local_2f8 = &local_2e8;
  }
  else {
    local_2e8 = *puVar9;
    local_2f8 = (ulong *)*plVar6;
  }
  local_2f0 = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_2f8);
  puVar9 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar9) {
    local_308 = *puVar9;
    lStack_300 = plVar6[3];
    local_318 = &local_308;
  }
  else {
    local_308 = *puVar9;
    local_318 = (ulong *)*plVar6;
  }
  local_310 = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  StreamableToString<int>(&local_1e8,&this->line_);
  uVar15 = 0xf;
  if (local_318 != &local_308) {
    uVar15 = local_308;
  }
  if (uVar15 < local_1e8._M_string_length + local_310) {
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      uVar16 = local_1e8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar16 < local_1e8._M_string_length + local_310) goto LAB_00171dd4;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1e8,0,(char *)0x0,(ulong)local_318);
  }
  else {
LAB_00171dd4:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_318,(ulong)local_1e8._M_dataplus._M_p);
  }
  puVar9 = puVar7 + 2;
  if ((ulong *)*puVar7 == puVar9) {
    local_2c8 = *puVar9;
    lStack_2c0 = puVar7[3];
    local_2d8 = &local_2c8;
  }
  else {
    local_2c8 = *puVar9;
    local_2d8 = (ulong *)*puVar7;
  }
  local_2d0 = puVar7[1];
  *puVar7 = puVar9;
  puVar7[1] = 0;
  *(undefined1 *)puVar9 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_2d8);
  p_Var17 = (_union_1457 *)(plVar6 + 2);
  if ((_union_1457 *)*plVar6 == p_Var17) {
    local_2a8.sa_handler = p_Var17->sa_handler;
    lStack_2a0 = plVar6[3];
    local_2b8.sa_handler = (__sighandler_t)&local_2a8;
  }
  else {
    local_2a8.sa_handler = p_Var17->sa_handler;
    local_2b8.sa_handler = (__sighandler_t)*plVar6;
  }
  local_2b0 = plVar6[1];
  *plVar6 = (long)p_Var17;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  StreamableToString<int>(&local_208,&local_20c);
  p_Var10 = (__sighandler_t)
            (CONCAT44(local_208._M_string_length._4_4_,(int)local_208._M_string_length) + local_2b0)
  ;
  _Var13 = (_union_1457)0xf;
  if ((_union_1457 *)local_2b8.sa_handler != &local_2a8) {
    _Var13 = local_2a8;
  }
  if ((ulong)_Var13 < p_Var10) {
    uVar16 = (__sighandler_t)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      uVar16 = local_208.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar16 < p_Var10) goto LAB_00171ef0;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_208,0,(char *)0x0,(ulong)local_2b8);
  }
  else {
LAB_00171ef0:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_2b8,(ulong)local_208._M_dataplus._M_p);
  }
  local_160.sa_handler = (__sighandler_t)&local_150;
  p_Var10 = (__sighandler_t)(puVar7 + 2);
  if ((__sighandler_t)*puVar7 == p_Var10) {
    local_150 = *(ulong *)p_Var10;
    uStack_148 = puVar7[3];
  }
  else {
    local_150 = *(ulong *)p_Var10;
    local_160.sa_handler = (__sighandler_t)*puVar7;
  }
  local_158 = (undefined1  [8])puVar7[1];
  *puVar7 = p_Var10;
  puVar7[1] = 0;
  *p_Var10 = (__sighandler_t)0x0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_160);
  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 == paVar12) {
    local_b8[0]._0_8_ = paVar12->_M_allocated_capacity;
    local_b8[0]._8_8_ = puVar7[3];
    local_c8.sa_handler = (__sighandler_t)local_b8;
  }
  else {
    local_b8[0]._0_8_ = paVar12->_M_allocated_capacity;
    local_c8.sa_handler = (__sighandler_t)*puVar7;
  }
  local_c0 = puVar7[1];
  *puVar7 = paVar12;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  StreamableToString<int>(&local_1a0,&local_234);
  uVar16 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.sa_handler != local_b8) {
    uVar16 = local_b8[0]._M_allocated_capacity;
  }
  if ((ulong)uVar16 < local_c0 + local_1a0._M_string_length) {
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1a0._M_dataplus._M_p._4_4_,local_1a0._M_dataplus._M_p._0_4_) !=
        &local_1a0.field_2) {
      uVar16 = local_1a0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar16 < local_c0 + local_1a0._M_string_length) goto LAB_00172042;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1a0,0,(char *)0x0,(ulong)local_c8);
  }
  else {
LAB_00172042:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_c8,
                        CONCAT44(local_1a0._M_dataplus._M_p._4_4_,local_1a0._M_dataplus._M_p._0_4_))
    ;
  }
  local_1c0 = &local_1b0;
  plVar6 = puVar7 + 2;
  if ((long *)*puVar7 == plVar6) {
    local_1b0 = *plVar6;
    uStack_1a8 = puVar7[3];
  }
  else {
    local_1b0 = *plVar6;
    local_1c0 = (long *)*puVar7;
  }
  local_1b8 = puVar7[1];
  *puVar7 = plVar6;
  puVar7[1] = 0;
  *(undefined1 *)plVar6 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_1a0._M_dataplus._M_p._4_4_,local_1a0._M_dataplus._M_p._0_4_) !=
      &local_1a0.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_1a0._M_dataplus._M_p._4_4_,local_1a0._M_dataplus._M_p._0_4_),
                    local_1a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.sa_handler != local_b8) {
    operator_delete(local_c8.sa_handler,local_b8[0]._M_allocated_capacity + 1);
  }
  if (local_160.sa_handler != (__sighandler_t)&local_150) {
    operator_delete(local_160.sa_handler,local_150 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,(ulong)(local_208.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((_union_1457 *)local_2b8.sa_handler != &local_2a8) {
    operator_delete(local_2b8.sa_handler,(ulong)(local_2a8.sa_handler + 1));
  }
  if (local_2d8 != &local_2c8) {
    operator_delete(local_2d8,local_2c8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if (local_318 != &local_308) {
    operator_delete(local_318,local_308 + 1);
  }
  if (local_2f8 != &local_2e8) {
    operator_delete(local_2f8,local_2e8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_allocated_capacity != &local_288) {
    operator_delete((void *)local_298._M_allocated_capacity,local_288._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  local_1e8.field_2._M_allocated_capacity = 0;
  local_1e8._M_dataplus._M_p = (pointer)0x0;
  local_1e8._M_string_length = 0;
  local_c8.sa_handler = (__sighandler_t)0x0;
  std::vector<char*,std::allocator<char*>>::emplace_back<char*>
            ((vector<char*,std::allocator<char*>> *)&local_1e8,(char **)&local_c8.sa_handler);
  GetInjectableArgvs_abi_cxx11_();
  Arguments::AddArguments<std::__cxx11::string>
            ((Arguments *)&local_1e8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_c8);
  cVar18._M_current = (char **)(local_1e8._M_string_length - 8);
  local_c8.sa_handler = (__sighandler_t)strdup((char *)local_180);
  std::vector<char_*,_std::allocator<char_*>_>::_M_insert_rval
            ((vector<char_*,_std::allocator<char_*>_> *)&local_1e8,cVar18,
             (value_type *)&local_c8.sa_handler);
  cVar18._M_current = (char **)(local_1e8._M_string_length - 8);
  local_c8.sa_handler = (__sighandler_t)strdup((char *)local_1c0);
  std::vector<char_*,_std::allocator<char_*>_>::_M_insert_rval
            ((vector<char_*,_std::allocator<char_*>_> *)&local_1e8,cVar18,
             (value_type *)&local_c8.sa_handler);
  local_c8.sa_handler = (__sighandler_t)local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"");
  std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.sa_handler != local_b8) {
    operator_delete(local_c8.sa_handler,local_b8[0]._M_allocated_capacity + 1);
  }
  CaptureStream(2,"stderr",(CapturedStream **)&g_captured_stderr);
  fflush((FILE *)0x0);
  local_208._M_dataplus._M_p = local_1e8._M_dataplus._M_p;
  local_208._M_string_length._0_4_ = local_238;
  memset(&local_160,0,0x98);
  sigemptyset((sigset_t *)local_158);
  local_160 = (_union_1457)0x1;
  do {
    iVar3 = sigaction(0x1b,(sigaction *)&local_160,(sigaction *)&local_c8);
    cVar2 = FLAGS_gtest_death_test_use_fork;
    if (iVar3 != -1) {
      iVar3 = -1;
      if (FLAGS_gtest_death_test_use_fork == '\0') {
        if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down == '\0') {
          AssumeRole();
        }
        uVar4 = getpagesize();
        __len = (size_t)(int)uVar4;
        __addr = mmap((void *)0x0,__len,3,0x22,-1,0);
        if (__addr == (void *)0xffffffffffffffff) {
          local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_258,"CHECK failed: File ","");
          puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_258);
          local_298._M_allocated_capacity = *puVar7;
          paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._M_allocated_capacity == paVar12) {
            local_288._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_288._8_8_ = puVar7[3];
            local_298._M_allocated_capacity = (size_type)&local_288;
          }
          else {
            local_288._M_allocated_capacity = paVar12->_M_allocated_capacity;
          }
          local_298._8_8_ = puVar7[1];
          *puVar7 = paVar12;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          puVar7 = (undefined8 *)std::__cxx11::string::append(local_298._M_local_buf);
          local_2f8 = (ulong *)*puVar7;
          puVar9 = puVar7 + 2;
          if (local_2f8 == puVar9) {
            local_2e8 = *puVar9;
            lStack_2e0 = puVar7[3];
            local_2f8 = &local_2e8;
          }
          else {
            local_2e8 = *puVar9;
          }
          local_2f0 = puVar7[1];
          *puVar7 = puVar9;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          local_230._M_dataplus._M_p._0_4_ = 0x55b;
          StreamableToString<int>(&local_278,(int *)&local_230);
          uVar15 = 0xf;
          if (local_2f8 != &local_2e8) {
            uVar15 = local_2e8;
          }
          if (uVar15 < local_278._M_string_length + local_2f0) {
            uVar16 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_278._M_dataplus._M_p != &local_278.field_2) {
              uVar16 = local_278.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar16 < local_278._M_string_length + local_2f0) goto LAB_001735f7;
            puVar7 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_278,0,(char *)0x0,(ulong)local_2f8)
            ;
          }
          else {
LAB_001735f7:
            puVar7 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_2f8,(ulong)local_278._M_dataplus._M_p);
          }
          local_318 = (ulong *)*puVar7;
          puVar9 = puVar7 + 2;
          if (local_318 == puVar9) {
            local_308 = *puVar9;
            lStack_300 = puVar7[3];
            local_318 = &local_308;
          }
          else {
            local_308 = *puVar9;
          }
          local_310 = puVar7[1];
          *puVar7 = puVar9;
          puVar7[1] = 0;
          *(undefined1 *)puVar9 = 0;
          puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_318);
          local_2d8 = (ulong *)*puVar7;
          puVar9 = puVar7 + 2;
          if (local_2d8 == puVar9) {
            local_2c8 = *puVar9;
            lStack_2c0 = puVar7[3];
            local_2d8 = &local_2c8;
          }
          else {
            local_2c8 = *puVar9;
          }
          local_2d0 = puVar7[1];
          *puVar7 = puVar9;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
        }
        else {
          lVar14 = 0;
          if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down != '\0') {
            lVar14 = __len - 0x40;
          }
          if ((0x40 < uVar4) && (((ulong)(lVar14 + (long)__addr) & 0x3f) == 0)) {
            iVar3 = clone(ExecDeathTestChildMain,(void *)(lVar14 + (long)__addr),0x11,&local_208);
            iVar5 = munmap(__addr,__len);
            if (iVar5 != -1) goto LAB_001724ef;
            goto LAB_001731b7;
          }
          local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_258,"CHECK failed: File ","");
          puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_258);
          local_298._M_allocated_capacity = *puVar7;
          paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._M_allocated_capacity == paVar12) {
            local_288._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_288._8_8_ = puVar7[3];
            local_298._M_allocated_capacity = (size_type)&local_288;
          }
          else {
            local_288._M_allocated_capacity = paVar12->_M_allocated_capacity;
          }
          local_298._8_8_ = puVar7[1];
          *puVar7 = paVar12;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          puVar7 = (undefined8 *)std::__cxx11::string::append(local_298._M_local_buf);
          local_2f8 = (ulong *)*puVar7;
          puVar9 = puVar7 + 2;
          if (local_2f8 == puVar9) {
            local_2e8 = *puVar9;
            lStack_2e0 = puVar7[3];
            local_2f8 = &local_2e8;
          }
          else {
            local_2e8 = *puVar9;
          }
          local_2f0 = puVar7[1];
          *puVar7 = puVar9;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          local_230._M_dataplus._M_p._0_4_ = 0x569;
          StreamableToString<int>(&local_278,(int *)&local_230);
          uVar15 = 0xf;
          if (local_2f8 != &local_2e8) {
            uVar15 = local_2e8;
          }
          if (uVar15 < local_278._M_string_length + local_2f0) {
            uVar16 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_278._M_dataplus._M_p != &local_278.field_2) {
              uVar16 = local_278.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar16 < local_278._M_string_length + local_2f0) goto LAB_00173708;
            puVar7 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_278,0,(char *)0x0,(ulong)local_2f8)
            ;
          }
          else {
LAB_00173708:
            puVar7 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_2f8,(ulong)local_278._M_dataplus._M_p);
          }
          local_318 = (ulong *)*puVar7;
          puVar9 = puVar7 + 2;
          if (local_318 == puVar9) {
            local_308 = *puVar9;
            lStack_300 = puVar7[3];
            local_318 = &local_308;
          }
          else {
            local_308 = *puVar9;
          }
          local_310 = puVar7[1];
          *puVar7 = puVar9;
          puVar7[1] = 0;
          *(undefined1 *)puVar9 = 0;
          puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_318);
          local_2d8 = (ulong *)*puVar7;
          puVar9 = puVar7 + 2;
          if (local_2d8 == puVar9) {
            local_2c8 = *puVar9;
            lStack_2c0 = puVar7[3];
            local_2d8 = &local_2c8;
          }
          else {
            local_2c8 = *puVar9;
          }
          local_2d0 = puVar7[1];
          *puVar7 = puVar9;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
        }
      }
      else {
LAB_001724ef:
        if ((cVar2 == '\0') || (iVar3 = fork(), iVar3 != 0)) {
          goto LAB_0017250b;
        }
        ExecDeathTestChildMain(&local_208);
LAB_001731b7:
        local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_258,"CHECK failed: File ","");
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_258);
        local_298._M_allocated_capacity = *puVar7;
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_allocated_capacity == paVar12) {
          local_288._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_288._8_8_ = puVar7[3];
          local_298._M_allocated_capacity = (size_type)&local_288;
        }
        else {
          local_288._M_allocated_capacity = paVar12->_M_allocated_capacity;
        }
        local_298._8_8_ = puVar7[1];
        *puVar7 = paVar12;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        puVar7 = (undefined8 *)std::__cxx11::string::append(local_298._M_local_buf);
        local_2f8 = (ulong *)*puVar7;
        puVar9 = puVar7 + 2;
        if (local_2f8 == puVar9) {
          local_2e8 = *puVar9;
          lStack_2e0 = puVar7[3];
          local_2f8 = &local_2e8;
        }
        else {
          local_2e8 = *puVar9;
        }
        local_2f0 = puVar7[1];
        *puVar7 = puVar9;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        local_230._M_dataplus._M_p._0_4_ = 0x56d;
        StreamableToString<int>(&local_278,(int *)&local_230);
        uVar15 = 0xf;
        if (local_2f8 != &local_2e8) {
          uVar15 = local_2e8;
        }
        if (uVar15 < local_278._M_string_length + local_2f0) {
          uVar16 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != &local_278.field_2) {
            uVar16 = local_278.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar16 < local_278._M_string_length + local_2f0) goto LAB_00173819;
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_278,0,(char *)0x0,(ulong)local_2f8);
        }
        else {
LAB_00173819:
          puVar7 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_2f8,(ulong)local_278._M_dataplus._M_p);
        }
        local_318 = (ulong *)*puVar7;
        puVar9 = puVar7 + 2;
        if (local_318 == puVar9) {
          local_308 = *puVar9;
          lStack_300 = puVar7[3];
          local_318 = &local_308;
        }
        else {
          local_308 = *puVar9;
        }
        local_310 = puVar7[1];
        *puVar7 = puVar9;
        puVar7[1] = 0;
        *(undefined1 *)puVar9 = 0;
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_318);
        local_2d8 = (ulong *)*puVar7;
        puVar9 = puVar7 + 2;
        if (local_2d8 == puVar9) {
          local_2c8 = *puVar9;
          lStack_2c0 = puVar7[3];
          local_2d8 = &local_2c8;
        }
        else {
          local_2c8 = *puVar9;
        }
        local_2d0 = puVar7[1];
        *puVar7 = puVar9;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
      }
      goto LAB_00172be1;
    }
    piVar8 = __errno_location();
  } while (*piVar8 == 4);
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"CHECK failed: File ","");
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_278);
  local_258._M_dataplus._M_p = (pointer)*plVar6;
  puVar9 = (ulong *)(plVar6 + 2);
  if ((ulong *)local_258._M_dataplus._M_p == puVar9) {
    local_258.field_2._M_allocated_capacity = *puVar9;
    local_258.field_2._8_8_ = plVar6[3];
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  }
  else {
    local_258.field_2._M_allocated_capacity = *puVar9;
  }
  local_258._M_string_length = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_258);
  local_298._M_allocated_capacity = *plVar6;
  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_allocated_capacity == paVar12) {
    local_288._M_allocated_capacity = paVar12->_M_allocated_capacity;
    local_288._8_8_ = plVar6[3];
    local_298._M_allocated_capacity = (size_type)&local_288;
  }
  else {
    local_288._M_allocated_capacity = paVar12->_M_allocated_capacity;
  }
  local_298._8_8_ = plVar6[1];
  *plVar6 = (long)paVar12;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_1a0._M_dataplus._M_p._0_4_ = 0x54f;
  StreamableToString<int>(&local_230,(int *)&local_1a0);
  uVar16 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_allocated_capacity != &local_288) {
    uVar16 = local_288._M_allocated_capacity;
  }
  if ((ulong)uVar16 < local_230._M_string_length + local_298._8_8_) {
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      uVar16 = local_230.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar16 < local_230._M_string_length + local_298._8_8_) goto LAB_001727b0;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_230,0,(char *)0x0,local_298._M_allocated_capacity);
  }
  else {
LAB_001727b0:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append
                       (local_298._M_local_buf,(ulong)local_230._M_dataplus._M_p);
  }
  local_2f8 = (ulong *)*puVar7;
  puVar9 = puVar7 + 2;
  if (local_2f8 == puVar9) {
    local_2e8 = *puVar9;
    lStack_2e0 = puVar7[3];
    local_2f8 = &local_2e8;
  }
  else {
    local_2e8 = *puVar9;
  }
  local_2f0 = puVar7[1];
  *puVar7 = puVar9;
  puVar7[1] = 0;
  *(undefined1 *)puVar9 = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f8);
  local_318 = (ulong *)*puVar7;
  puVar9 = puVar7 + 2;
  if (local_318 == puVar9) {
    local_308 = *puVar9;
    lStack_300 = puVar7[3];
    local_318 = &local_308;
  }
  else {
    local_308 = *puVar9;
  }
  local_310 = puVar7[1];
  *puVar7 = puVar9;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  goto LAB_00172b86;
LAB_001725a0:
  do {
    iVar5 = close(local_234);
    if (iVar5 != -1) {
      *(int *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x3c = iVar3;
      (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = local_238;
      (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
      Arguments::~Arguments((Arguments *)&local_1e8);
      if (local_1c0 != &local_1b0) {
        operator_delete(local_1c0,local_1b0 + 1);
      }
      if (local_180 != &local_170) {
        operator_delete(local_180,local_170 + 1);
      }
      return OVERSEE_TEST;
    }
    piVar8 = __errno_location();
  } while (*piVar8 == 4);
  local_298._M_allocated_capacity = (size_type)&local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"CHECK failed: File ","");
  puVar7 = (undefined8 *)std::__cxx11::string::append(local_298._M_local_buf);
  local_2f8 = (ulong *)*puVar7;
  puVar9 = puVar7 + 2;
  if (local_2f8 == puVar9) {
    local_2e8 = *puVar9;
    lStack_2e0 = puVar7[3];
    local_2f8 = &local_2e8;
  }
  else {
    local_2e8 = *puVar9;
  }
  local_2f0 = puVar7[1];
  *puVar7 = puVar9;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f8);
  local_318 = (ulong *)*puVar7;
  puVar9 = puVar7 + 2;
  if (local_318 == puVar9) {
    local_308 = *puVar9;
    lStack_300 = puVar7[3];
    local_318 = &local_308;
  }
  else {
    local_308 = *puVar9;
  }
  local_310 = puVar7[1];
  *puVar7 = puVar9;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  local_278._M_dataplus._M_p._0_4_ = 0x5ac;
  StreamableToString<int>(&local_258,(int *)&local_278);
  uVar15 = 0xf;
  if (local_318 != &local_308) {
    uVar15 = local_308;
  }
  if (uVar15 < local_258._M_string_length + local_310) {
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      uVar16 = local_258.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar16 < local_258._M_string_length + local_310) goto LAB_001729ea;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_258,0,(char *)0x0,(ulong)local_318);
  }
  else {
LAB_001729ea:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_318,(ulong)local_258._M_dataplus._M_p);
  }
  local_2d8 = (ulong *)*puVar7;
  puVar9 = puVar7 + 2;
  if (local_2d8 == puVar9) {
    local_2c8 = *puVar9;
    lStack_2c0 = puVar7[3];
    local_2d8 = &local_2c8;
  }
  else {
    local_2c8 = *puVar9;
  }
  local_2d0 = puVar7[1];
  *puVar7 = puVar9;
  puVar7[1] = 0;
  *(undefined1 *)puVar9 = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d8);
  local_2b8.sa_handler = (__sighandler_t)*puVar7;
  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8.sa_handler == paVar12) {
    local_2a8 = (_union_1457)paVar12->_M_allocated_capacity;
    lStack_2a0 = puVar7[3];
    local_2b8.sa_handler = (__sighandler_t)&local_2a8;
  }
  else {
    local_2a8 = (_union_1457)paVar12->_M_allocated_capacity;
  }
  local_2b0 = puVar7[1];
  *puVar7 = paVar12;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_2b8);
  local_160.sa_handler = (__sighandler_t)*plVar6;
  p_Var10 = (__sighandler_t)(plVar6 + 2);
  if (local_160.sa_handler == p_Var10) {
    local_150 = *(ulong *)p_Var10;
    uStack_148 = plVar6[3];
    local_160.sa_handler = (__sighandler_t)&local_150;
  }
  else {
    local_150 = *(ulong *)p_Var10;
  }
  local_158 = (undefined1  [8])plVar6[1];
  *plVar6 = (long)p_Var10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_160);
  local_c8.sa_handler = (__sighandler_t)*puVar7;
  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.sa_handler == paVar12) {
    local_b8[0]._0_8_ = paVar12->_M_allocated_capacity;
    local_b8[0]._8_8_ = puVar7[3];
    local_c8.sa_handler = (__sighandler_t)local_b8;
  }
  else {
LAB_00172d87:
    local_b8[0]._0_8_ = paVar12->_M_allocated_capacity;
  }
LAB_00172d92:
  _Var13 = *(_union_1457 *)(puVar7 + 1);
  p_Var17 = &local_c8;
  goto LAB_00172d9e;
  while (piVar8 = __errno_location(), *piVar8 == 4) {
LAB_0017250b:
    iVar5 = sigaction(0x1b,(sigaction *)&local_c8,(sigaction *)0x0);
    if (iVar5 != -1) {
      if (iVar3 != -1) goto LAB_001725a0;
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"CHECK failed: File ","")
      ;
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_258);
      local_298._M_allocated_capacity = *puVar7;
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_allocated_capacity == paVar12) {
        local_288._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_288._8_8_ = puVar7[3];
        local_298._M_allocated_capacity = (size_type)&local_288;
      }
      else {
        local_288._M_allocated_capacity = paVar12->_M_allocated_capacity;
      }
      local_298._8_8_ = puVar7[1];
      *puVar7 = paVar12;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      puVar7 = (undefined8 *)std::__cxx11::string::append(local_298._M_local_buf);
      local_2f8 = (ulong *)*puVar7;
      puVar9 = puVar7 + 2;
      if (local_2f8 == puVar9) {
        local_2e8 = *puVar9;
        lStack_2e0 = puVar7[3];
        local_2f8 = &local_2e8;
      }
      else {
        local_2e8 = *puVar9;
      }
      local_2f0 = puVar7[1];
      *puVar7 = puVar9;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      local_230._M_dataplus._M_p._0_4_ = 0x57d;
      StreamableToString<int>(&local_278,(int *)&local_230);
      uVar15 = 0xf;
      if (local_2f8 != &local_2e8) {
        uVar15 = local_2e8;
      }
      if (uVar15 < local_278._M_string_length + local_2f0) {
        uVar16 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          uVar16 = local_278.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar16 < local_278._M_string_length + local_2f0) goto LAB_0017331f;
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_278,0,(char *)0x0,(ulong)local_2f8);
      }
      else {
LAB_0017331f:
        puVar7 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_2f8,(ulong)local_278._M_dataplus._M_p);
      }
      local_318 = (ulong *)*puVar7;
      puVar9 = puVar7 + 2;
      if (local_318 == puVar9) {
        local_308 = *puVar9;
        lStack_300 = puVar7[3];
        local_318 = &local_308;
      }
      else {
        local_308 = *puVar9;
      }
      local_310 = puVar7[1];
      *puVar7 = puVar9;
      puVar7[1] = 0;
      *(undefined1 *)puVar9 = 0;
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_318);
      local_2d8 = (ulong *)*puVar7;
      puVar9 = puVar7 + 2;
      if (local_2d8 == puVar9) {
        local_2c8 = *puVar9;
        lStack_2c0 = puVar7[3];
        local_2d8 = &local_2c8;
      }
      else {
        local_2c8 = *puVar9;
      }
      local_2d0 = puVar7[1];
      *puVar7 = puVar9;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      goto LAB_00172be1;
    }
  }
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"CHECK failed: File ","");
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_278);
  local_258._M_dataplus._M_p = (pointer)*puVar7;
  puVar9 = puVar7 + 2;
  if ((ulong *)local_258._M_dataplus._M_p == puVar9) {
    local_258.field_2._M_allocated_capacity = *puVar9;
    local_258.field_2._8_8_ = puVar7[3];
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  }
  else {
    local_258.field_2._M_allocated_capacity = *puVar9;
  }
  local_258._M_string_length = puVar7[1];
  *puVar7 = puVar9;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_258);
  local_298._M_allocated_capacity = *puVar7;
  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_allocated_capacity == paVar12) {
    local_288._M_allocated_capacity = paVar12->_M_allocated_capacity;
    local_288._8_8_ = puVar7[3];
    local_298._M_allocated_capacity = (size_type)&local_288;
  }
  else {
    local_288._M_allocated_capacity = paVar12->_M_allocated_capacity;
  }
  local_298._8_8_ = puVar7[1];
  *puVar7 = paVar12;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  local_1a0._M_dataplus._M_p._0_4_ = 0x57a;
  StreamableToString<int>(&local_230,(int *)&local_1a0);
  uVar16 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_allocated_capacity != &local_288) {
    uVar16 = local_288._M_allocated_capacity;
  }
  if ((ulong)uVar16 < local_230._M_string_length + local_298._8_8_) {
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      uVar16 = local_230.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar16 < local_230._M_string_length + local_298._8_8_) goto LAB_001728e2;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_230,0,(char *)0x0,local_298._M_allocated_capacity);
  }
  else {
LAB_001728e2:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append
                       (local_298._M_local_buf,(ulong)local_230._M_dataplus._M_p);
  }
  local_2f8 = (ulong *)*puVar7;
  puVar9 = puVar7 + 2;
  if (local_2f8 == puVar9) {
    local_2e8 = *puVar9;
    lStack_2e0 = puVar7[3];
    local_2f8 = &local_2e8;
  }
  else {
    local_2e8 = *puVar9;
  }
  local_2f0 = puVar7[1];
  *puVar7 = puVar9;
  puVar7[1] = 0;
  *(undefined1 *)puVar9 = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f8);
  local_318 = (ulong *)*puVar7;
  puVar9 = puVar7 + 2;
  if (local_318 == puVar9) {
    local_308 = *puVar9;
    lStack_300 = puVar7[3];
    local_318 = &local_308;
  }
  else {
    local_308 = *puVar9;
  }
  local_310 = puVar7[1];
  *puVar7 = puVar9;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
LAB_00172b86:
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_318);
  local_2d8 = (ulong *)*puVar7;
  puVar9 = puVar7 + 2;
  if (local_2d8 == puVar9) {
    local_2c8 = *puVar9;
    lStack_2c0 = puVar7[3];
    local_2d8 = &local_2c8;
  }
  else {
    local_2c8 = *puVar9;
  }
  local_2d0 = puVar7[1];
  *puVar7 = puVar9;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
LAB_00172be1:
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d8);
  local_2b8.sa_handler = (__sighandler_t)*puVar7;
  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8.sa_handler == paVar12) {
    local_2a8 = (_union_1457)paVar12->_M_allocated_capacity;
    lStack_2a0 = puVar7[3];
    local_2b8.sa_handler = (__sighandler_t)&local_2a8;
  }
  else {
    local_2a8 = (_union_1457)paVar12->_M_allocated_capacity;
  }
  _Var13 = *(_union_1457 *)(puVar7 + 1);
  p_Var17 = &local_2b8;
LAB_00172d9e:
  p_Var17[1] = _Var13;
  *puVar7 = paVar12;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  DeathTestAbort((string *)p_Var17);
}

Assistant:

DeathTest::TestRole ExecDeathTest::AssumeRole() {
  const UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const TestInfo* const info = impl->current_test_info();
  const int death_test_index = info->result()->death_test_count();

  if (flag != nullptr) {
    set_write_fd(flag->write_fd());
    return EXECUTE_TEST;
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);
  // Clear the close-on-exec flag on the write end of the pipe, lest
  // it be closed when the child process does an exec:
  GTEST_DEATH_TEST_CHECK_(fcntl(pipe_fd[1], F_SETFD, 0) != -1);

  const std::string filter_flag = std::string("--") + GTEST_FLAG_PREFIX_ +
                                  kFilterFlag + "=" + info->test_suite_name() +
                                  "." + info->name();
  const std::string internal_flag =
      std::string("--") + GTEST_FLAG_PREFIX_ + kInternalRunDeathTestFlag + "="
      + file_ + "|" + StreamableToString(line_) + "|"
      + StreamableToString(death_test_index) + "|"
      + StreamableToString(pipe_fd[1]);
  Arguments args;
  args.AddArguments(GetArgvsForDeathTestChildProcess());
  args.AddArgument(filter_flag.c_str());
  args.AddArgument(internal_flag.c_str());

  DeathTest::set_last_death_test_message("");

  CaptureStderr();
  // See the comment in NoExecDeathTest::AssumeRole for why the next line
  // is necessary.
  FlushInfoLog();

  const pid_t child_pid = ExecDeathTestSpawnChild(args.Argv(), pipe_fd[0]);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
  set_child_pid(child_pid);
  set_read_fd(pipe_fd[0]);
  set_spawned(true);
  return OVERSEE_TEST;
}